

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall
rsg::Shader::getOutputs
          (Shader *this,
          vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *outputs)

{
  bool bVar1;
  Storage SVar2;
  reference ppVVar3;
  Variable *local_38;
  Variable *var;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_28;
  const_iterator i;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *globalVars;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *outputs_local;
  Shader *this_local;
  
  std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::clear(outputs);
  i._M_current = (Variable **)VariableScope::getDeclaredVariables(&this->m_globalScope);
  local_28._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                 ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)i._M_current);
  while( true ) {
    var = (Variable *)
          std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end
                    ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)i._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                        *)&var);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
              ::operator*(&local_28);
    local_38 = *ppVVar3;
    SVar2 = rsg::Variable::getStorage(local_38);
    if (SVar2 == STORAGE_SHADER_OUT) {
      std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::push_back
                (outputs,&local_38);
    }
    __gnu_cxx::
    __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
    ::operator++(&local_28,0);
  }
  return;
}

Assistant:

void Shader::getOutputs (vector<const Variable*>& outputs) const
{
	outputs.clear();
	const vector<Variable*>& globalVars = m_globalScope.getDeclaredVariables();
	for (vector<Variable*>::const_iterator i = globalVars.begin(); i != globalVars.end(); i++)
	{
		const Variable* var = *i;
		if (var->getStorage() == Variable::STORAGE_SHADER_OUT)
			outputs.push_back(var);
	}
}